

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_sales.cpp
# Opt level: O0

void use_sales(void)

{
  int iVar1;
  double *pdVar2;
  ostream *poVar3;
  void *pvVar4;
  string *psVar5;
  NBadIndex *error_2;
  BadIndex *error_3;
  NBadIndex *error;
  BadIndex *error_1;
  int i;
  undefined1 local_308 [8];
  LabeledSales sales2;
  Sales sales1;
  double val_s2 [12];
  double val_s1 [12];
  string local_140;
  undefined1 local_120 [8];
  LabeledSales ls;
  Sales *ps;
  undefined1 local_78 [8];
  Sales sales;
  
  L15_4::Sales::Sales((Sales *)local_78,0);
  pdVar2 = L15_4::Sales::operator[]((Sales *)local_78,1);
  *pdVar2 = 100.0;
  poVar3 = std::operator<<((ostream *)&std::cout,"2018 sales: ");
  pdVar2 = L15_4::Sales::operator[]((Sales *)local_78,1);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,*pdVar2);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  ls._label.field_2._8_8_ = local_78;
  poVar3 = std::operator<<((ostream *)&std::cout,"2018 ps: ");
  pdVar2 = (double *)
           (**(code **)(*(long *)ls._label.field_2._8_8_ + 0x18))(ls._label.field_2._8_8_,1);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,*pdVar2);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"abcd",(allocator *)((long)val_s1 + 0x5f));
  L15_4::LabeledSales::LabeledSales((LabeledSales *)local_120,&local_140,0);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)((long)val_s1 + 0x5f));
  poVar3 = std::operator<<((ostream *)&std::cout,"abcd: ");
  pdVar2 = L15_4::LabeledSales::operator[]((LabeledSales *)local_120,2);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,*pdVar2);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  val_s1[9] = 1011.0;
  val_s1[10] = 1012.0;
  val_s1[7] = 1009.0;
  val_s1[8] = 1010.0;
  val_s1[5] = 1007.0;
  val_s1[6] = 1008.0;
  val_s1[3] = 1005.0;
  val_s1[4] = 1006.0;
  val_s1[1] = 1003.0;
  val_s1[2] = 1004.0;
  val_s2[0xb] = 1001.0;
  val_s1[0] = 1002.0;
  val_s2[9] = 121.0;
  val_s2[10] = 202.0;
  val_s2[7] = 99.0;
  val_s2[8] = 109.0;
  val_s2[5] = 77.0;
  val_s2[6] = 88.0;
  val_s2[3] = 55.0;
  val_s2[4] = 66.0;
  val_s2[1] = 33.0;
  val_s2[2] = 44.0;
  sales1._year = 0;
  sales1._108_4_ = 0x40260000;
  val_s2[0] = 22.0;
  L15_4::Sales::Sales((Sales *)((long)&sales2._label.field_2 + 8),2000,val_s2 + 0xb,0xc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"End of the world",(allocator *)((long)&error_1 + 7));
  L15_4::LabeledSales::LabeledSales
            ((LabeledSales *)local_308,(string *)&i,0x7dc,(double *)&sales1._year,0xc);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&error_1 + 7));
  std::operator<<((ostream *)&std::cout,"First try block:\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Year = ");
  iVar1 = L15_4::Sales::get_year((Sales *)((long)&sales2._label.field_2 + 8));
  pvVar4 = (void *)std::ostream::operator<<(poVar3,iVar1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  for (error_1._0_4_ = 0; (int)error_1 < 0xc; error_1._0_4_ = (int)error_1 + 1) {
    pdVar2 = L15_4::Sales::operator[]((Sales *)((long)&sales2._label.field_2 + 8),(int)error_1);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*pdVar2);
    std::operator<<(poVar3,' ');
    if ((int)error_1 % 6 == 5) {
      std::operator<<((ostream *)&std::cout,"\n");
    }
  }
  std::operator<<((ostream *)&std::cout,"\n");
  poVar3 = std::operator<<((ostream *)&std::cout,"Year = ");
  iVar1 = L15_4::Sales::get_year((Sales *)local_308);
  pvVar4 = (void *)std::ostream::operator<<(poVar3,iVar1);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Label = ");
  psVar5 = L15_4::LabeledSales::get_label_abi_cxx11_((LabeledSales *)local_308);
  poVar3 = std::operator<<(poVar3,(string *)psVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (error_1._0_4_ = 0; (int)error_1 < 0xd; error_1._0_4_ = (int)error_1 + 1) {
    pdVar2 = L15_4::LabeledSales::operator[]((LabeledSales *)local_308,(int)error_1);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,*pdVar2);
    std::operator<<(poVar3,' ');
    if ((int)error_1 % 6 == 5) {
      std::operator<<((ostream *)&std::cout,"\n");
    }
  }
  std::operator<<((ostream *)&std::cout,"End of the try block 1\n");
  std::operator<<((ostream *)&std::cout,"\nNext try block...\n");
  pdVar2 = L15_4::LabeledSales::operator[]((LabeledSales *)local_308,2);
  *pdVar2 = 22222.0;
  pdVar2 = L15_4::Sales::operator[]((Sales *)((long)&sales2._label.field_2 + 8),0x14);
  *pdVar2 = 202020.0;
  std::operator<<((ostream *)&std::cout,"End of try block 2...\n");
  L15_4::LabeledSales::~LabeledSales((LabeledSales *)local_308);
  L15_4::Sales::~Sales((Sales *)((long)&sales2._label.field_2 + 8));
  L15_4::LabeledSales::~LabeledSales((LabeledSales *)local_120);
  L15_4::Sales::~Sales((Sales *)local_78);
  return;
}

Assistant:

void use_sales() {
    //
    using namespace L15_4;
//    using namespace std;

    //
    Sales sales;
    sales[1] = 100;
    std::cout << "2018 sales: " << sales[1] << std::endl;

    //  allocate a pointer, points to 'sales' actual location
    Sales *ps = &sales;
    std::cout << "2018 ps: " << (*ps)[1] << std::endl;

    LabeledSales ls("abcd");
    std::cout << "abcd: " << ls[2] << std::endl;

    double val_s1[12] = {
            1001, 1002, 1003, 1004, 1005, 1006, 1007, 1008, 1009, 1010, 1011, 1012
    };

    double val_s2[12] = {
            11, 22, 33, 44, 55, 66, 77, 88, 99, 109, 121, 202,
    };

    Sales sales1(2000, val_s1, 12);
    LabeledSales sales2("End of the world", 2012, val_s2, 12);

    std::cout << "First try block:\n";
    try {
        int i;
        std::cout << "Year = " << sales1.get_year() << std::endl;
        for (i = 0; i < sales1.MONTHS; i++) {
            std::cout << sales1[i] << ' ';
            if (i % 6 == 5) {
                std::cout << "\n";
            }
        }

        std::cout << "\n";

        std::cout << "Year = " << sales2.get_year() << std::endl;
        std::cout << "Label = " << sales2.get_label() << std::endl;
        for (i = 0; i <= sales2.MONTHS; i++) {
            std::cout << sales2[i] << ' ';
            if (i % 6 == 5) {
                std::cout << "\n";
            }
        }

        std::cout << "End of the try block 1\n";
    } catch(LabeledSales::NBadIndex & error) {
        //  error.what(): something like error.message in js?
        std::cout << "Catch NBadIndex:" << error.what();
        std::cout << "Company: " << error.get_label_value() << std::endl;
        std::cout << "Bad index: " << error.get_bad_value() << std::endl;
    } catch(Sales::BadIndex & error) {
        std::cout << error.what();
        std::cout << "Bad index: " << error.get_bad_value() << std::endl;
    }

    std::cout << "\nNext try block...\n";

    try {
        sales2[2] = 22222;
        sales1[20] = 202020;
        std::cout << "End of try block 2...\n";
    } catch(LabeledSales::NBadIndex & error) {
        //  error.what(): something like error.message in js?
        std::cout << "Catch NBadIndex:" << error.what();
        std::cout << "Company: " << error.get_label_value() << std::endl;
        std::cout << "Bad index: " << error.get_bad_value() << std::endl;
    } catch(Sales::BadIndex & error) {
        std::cout << error.what();
        std::cout << "Bad index: " << error.get_bad_value() << std::endl;
    }
}